

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O1

int write_s98v2(s98c *ctx,FILE *fp)

{
  s98deviceinfo *psVar1;
  size_t sVar2;
  uint32_t uVar3;
  int iVar4;
  long lVar5;
  uint32_t uVar6;
  int iVar7;
  ulong uVar8;
  uint32_t local_54;
  char *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  ulong local_38;
  
  local_50 = find_tag_value(ctx,"title");
  local_38 = 0;
  if (local_50 != (char *)0x0) {
    sVar2 = strlen(local_50);
    local_38 = (ulong)((int)sVar2 + 1);
  }
  iVar4 = (ctx->header).device_count * 0x10;
  uVar3 = iVar4 + 0x30;
  if (local_50 == (char *)0x0) {
    uVar3 = 0;
  }
  iVar4 = iVar4 + 0x30 + (int)local_38;
  local_40 = ctx->p;
  local_48 = ctx->dump_buffer;
  uVar6 = ((int)ctx->loop_start - (int)local_48) + iVar4;
  if (ctx->loop_start == (uint8_t *)0x0) {
    uVar6 = 0;
  }
  iVar7 = (int)ctx->dump_start - (int)local_48;
  if (ctx->dump_start == (uint8_t *)0x0) {
    iVar7 = 0;
  }
  (ctx->header).offset_to_tag = uVar3;
  (ctx->header).offset_to_dump = iVar7 + iVar4;
  (ctx->header).offset_to_loop = uVar6;
  fwrite("S98",1,3,(FILE *)fp);
  fputc((ctx->header).version + 0x30,(FILE *)fp);
  local_54 = (ctx->header).timer_numerator;
  fwrite(&local_54,1,4,(FILE *)fp);
  local_54 = (ctx->header).timer_denominator;
  fwrite(&local_54,1,4,(FILE *)fp);
  local_54 = 0;
  fwrite(&local_54,1,4,(FILE *)fp);
  local_54 = (ctx->header).offset_to_tag;
  fwrite(&local_54,1,4,(FILE *)fp);
  local_54 = (ctx->header).offset_to_dump;
  fwrite(&local_54,1,4,(FILE *)fp);
  local_54 = (ctx->header).offset_to_loop;
  fwrite(&local_54,1,4,(FILE *)fp);
  local_54 = 0;
  fwrite(&local_54,1,4,(FILE *)fp);
  if ((ctx->header).device_count != 0) {
    lVar5 = 0xc;
    uVar8 = 0;
    do {
      psVar1 = ctx->devices;
      local_54 = *(uint32_t *)((long)psVar1 + lVar5 + -0xc);
      fwrite(&local_54,1,4,(FILE *)fp);
      local_54 = *(uint32_t *)((long)psVar1 + lVar5 + -8);
      fwrite(&local_54,1,4,(FILE *)fp);
      local_54 = *(uint32_t *)((long)psVar1 + lVar5 + -4);
      fwrite(&local_54,1,4,(FILE *)fp);
      local_54 = *(uint32_t *)((long)&psVar1->device + lVar5);
      fwrite(&local_54,1,4,(FILE *)fp);
      uVar8 = uVar8 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar8 < (ctx->header).device_count);
  }
  local_54 = 0;
  fwrite(&local_54,1,4,(FILE *)fp);
  local_54 = 0;
  fwrite(&local_54,1,4,(FILE *)fp);
  local_54 = 0;
  fwrite(&local_54,1,4,(FILE *)fp);
  local_54 = 0;
  fwrite(&local_54,1,4,(FILE *)fp);
  if (0 < (int)local_38) {
    fwrite(local_50,1,local_38 & 0xffffffff,(FILE *)fp);
  }
  fwrite(ctx->dump_buffer,1,(long)((int)local_40 - (int)local_48),(FILE *)fp);
  return 0;
}

Assistant:

int write_s98v2(struct s98c* ctx, FILE* fp)
{
    int header_size = 0x20; 
    char* title = find_tag_value(ctx, "title");
    int tag_length = (title == NULL) ? 0 : strlen(title) + 1;
    int devices_size = sizeof(struct s98deviceinfo) * (ctx->header.device_count + 1);
    int dump_offset = header_size + devices_size + tag_length;
    int tag_offset = (title == NULL) ? 0 : header_size + devices_size;
    int loop_offset = 0;
    int dump_length = ctx->p - ctx->dump_buffer;

    if(ctx->loop_start != NULL) {
        loop_offset = dump_offset + (ctx->loop_start - ctx->dump_buffer);
    }
    if(ctx->dump_start != NULL) {
        dump_offset += (ctx->dump_start - ctx->dump_buffer);
    }
    ctx->header.offset_to_tag = tag_offset;
    ctx->header.offset_to_dump = dump_offset;
    ctx->header.offset_to_loop = loop_offset;

    fwrite("S98", 1, 3, fp); // 0
    fputc('0' + ctx->header.version, fp); // 3
    write_dword(fp, ctx->header.timer_numerator); // 4
    write_dword(fp, ctx->header.timer_denominator); // 8
    write_dword(fp, 0); // c
    write_dword(fp, ctx->header.offset_to_tag); // 10 
    write_dword(fp, ctx->header.offset_to_dump); //14
    write_dword(fp, ctx->header.offset_to_loop); //18
    write_dword(fp, 0);

    int i;
    for(i = 0; i < ctx->header.device_count; i++) {
        struct s98deviceinfo* info = ctx->devices + i;

        write_dword(fp, info->device);
        write_dword(fp, info->clock);
        write_dword(fp, info->panpot);
        write_dword(fp, info->reserved);
    }
    write_dword(fp, s98NONE);
    write_dword(fp, 0);
    write_dword(fp, 0);
    write_dword(fp, 0);
    
    if(tag_length > 0) {
        fwrite(title, 1, tag_length, fp);
    }
        
    fwrite(ctx->dump_buffer, 1, dump_length, fp);

    return 0;
}